

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O0

int __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::setTipPartials
          (BeagleCPUImpl<double,_1,_0> *this,int tipIndex,double *inPartials)

{
  void *pvVar1;
  int in_ESI;
  double *in_RDI;
  int k_1;
  int k;
  int i;
  int l;
  double *tmpRealPartialsOffset;
  double *inPartialsOffset;
  int in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffc8;
  int iVar2;
  undefined4 in_stack_ffffffffffffffcc;
  int iVar3;
  BeagleCPUImpl<double,_1,_0> *in_stack_ffffffffffffffd0;
  undefined8 *puVar4;
  int local_4;
  
  if ((in_ESI < 0) || (*(int *)(in_RDI + 2) <= in_ESI)) {
    local_4 = -5;
  }
  else {
    if (*(long *)((long)in_RDI[0x16] + (long)in_ESI * 8) == 0) {
      pvVar1 = mallocAligned(in_stack_ffffffffffffffd0,
                             CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      *(void **)((long)in_RDI[0x16] + (long)in_ESI * 8) = pvVar1;
      if (*(long *)((long)in_RDI[0x16] + (long)in_ESI * 8) == 0) {
        return -2;
      }
    }
    puVar4 = *(undefined8 **)((long)in_RDI[0x16] + (long)in_ESI * 8);
    for (iVar3 = 0; iVar3 < *(int *)((long)in_RDI + 0x34); iVar3 = iVar3 + 1) {
      for (iVar2 = 0; iVar2 < *(int *)((long)in_RDI + 0x14); iVar2 = iVar2 + 1) {
        beagleMemCpy<double>
                  ((double *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),in_RDI,0)
        ;
        puVar4 = puVar4 + *(int *)((long)in_RDI + 0x24);
        for (in_stack_ffffffffffffffc4 = *(int *)((long)in_RDI + 0x24);
            in_stack_ffffffffffffffc4 < *(int *)((long)in_RDI + 0x2c);
            in_stack_ffffffffffffffc4 = in_stack_ffffffffffffffc4 + 1) {
          *puVar4 = 0;
          puVar4 = puVar4 + 1;
        }
      }
      for (in_stack_ffffffffffffffc0 = 0;
          in_stack_ffffffffffffffc0 <
          *(int *)((long)in_RDI + 0x2c) * (*(int *)(in_RDI + 3) - *(int *)((long)in_RDI + 0x14));
          in_stack_ffffffffffffffc0 = in_stack_ffffffffffffffc0 + 1) {
        *puVar4 = 0;
        puVar4 = puVar4 + 1;
      }
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::setTipPartials(int tipIndex,
                                  const double* inPartials) {
    if (tipIndex < 0 || tipIndex >= kTipCount)
        return BEAGLE_ERROR_OUT_OF_RANGE;
    if(gPartials[tipIndex] == NULL) {
        gPartials[tipIndex] = (REALTYPE*) mallocAligned(sizeof(REALTYPE) * kPartialsSize);
        // TODO: What if this throws a memory full error?
        if (gPartials[tipIndex] == 0L)
            return BEAGLE_ERROR_OUT_OF_MEMORY;
    }

    const double* inPartialsOffset;
    REALTYPE* tmpRealPartialsOffset = gPartials[tipIndex];
    for (int l = 0; l < kCategoryCount; l++) {
        inPartialsOffset = inPartials;
        for (int i = 0; i < kPatternCount; i++) {
            beagleMemCpy(tmpRealPartialsOffset, inPartialsOffset, kStateCount);
            tmpRealPartialsOffset += kStateCount;
            // Pad extra buffer with zeros
            for(int k = kStateCount; k < kPartialsPaddedStateCount; k++) {
                *tmpRealPartialsOffset++ = 0;
            }
            inPartialsOffset += kStateCount;
        }
        // Pad extra buffer with zeros
        for(int k = 0; k < kPartialsPaddedStateCount * (kPaddedPatternCount - kPatternCount); k++) {
            *tmpRealPartialsOffset++ = 0;
        }
    }

    return BEAGLE_SUCCESS;
}